

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

void ObsGetLegalMove(pyhanabi_observation_t *observation,int index,pyhanabi_move_t *move)

{
  value_type *pvVar1;
  const_reference pvVar2;
  undefined8 *in_RDX;
  long *in_RDI;
  size_type in_stack_ffffffffffffffb8;
  vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
  *in_stack_ffffffffffffffc0;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x324,"void ObsGetLegalMove(pyhanabi_observation_t *, int, pyhanabi_move_t *)");
  }
  if (*in_RDI != 0) {
    if (in_RDX != (undefined8 *)0x0) {
      pvVar1 = (value_type *)operator_new(8);
      hanabi_learning_env::HanabiObservation::LegalMoves((HanabiObservation *)*in_RDI);
      pvVar2 = std::
               vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
               ::at(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      *pvVar1 = *pvVar2;
      *in_RDX = pvVar1;
      return;
    }
    __assert_fail("move != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x326,"void ObsGetLegalMove(pyhanabi_observation_t *, int, pyhanabi_move_t *)");
  }
  __assert_fail("observation->observation != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x325,"void ObsGetLegalMove(pyhanabi_observation_t *, int, pyhanabi_move_t *)");
}

Assistant:

void ObsGetLegalMove(pyhanabi_observation_t* observation, int index,
                     pyhanabi_move_t* move) {
  REQUIRE(observation != nullptr);
  REQUIRE(observation->observation != nullptr);
  REQUIRE(move != nullptr);
  move->move = new hanabi_learning_env::HanabiMove(
      (reinterpret_cast<hanabi_learning_env::HanabiObservation*>(
           observation->observation)
           ->LegalMoves()
           .at(index)));
}